

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Capturer::~Capturer(Capturer *this)

{
  pointer pMVar1;
  bool bVar2;
  reference pvVar3;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_RDI;
  size_t i;
  pointer in_stack_fffffffffffffff0;
  
  bVar2 = uncaught_exceptions();
  if (!bVar2) {
    for (in_stack_fffffffffffffff0 = (pointer)0x0;
        in_stack_fffffffffffffff0 <
        in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish;
        in_stack_fffffffffffffff0 =
             (pointer)((long)&(in_stack_fffffffffffffff0->macroName).m_start + 1)) {
      pMVar1 = in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
               operator[](in_RDI,(size_type)in_stack_fffffffffffffff0);
      (**(code **)((pMVar1->macroName).m_start + 0x38))(pMVar1,pvVar3);
    }
  }
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
             in_stack_fffffffffffffff0);
  return;
}

Assistant:

Capturer::~Capturer() {
        if ( !uncaught_exceptions() ){
            assert( m_captured == m_messages.size() );
            for( size_t i = 0; i < m_captured; ++i  )
                m_resultCapture.popScopedMessage( m_messages[i] );
        }
    }